

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O3

void __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp:365:52)>
::move(impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_global_object_cpp:365:52)>
       *this,model *to)

{
  uint32_t uVar1;
  gc_heap *this_00;
  
  this_00 = (this->f).global.super_gc_heap_ptr_untyped.heap_;
  uVar1 = (this->f).global.super_gc_heap_ptr_untyped.pos_;
  to->_vptr_model = (_func_int **)&PTR_destroy_001d90d0;
  to[1]._vptr_model = (_func_int **)this_00;
  *(uint32_t *)&to[2]._vptr_model = uVar1;
  if (this_00 != (gc_heap *)0x0) {
    gc_heap::attach(this_00,(gc_heap_ptr_untyped *)(to + 1));
    return;
  }
  return;
}

Assistant:

void move(model* to) override { new (to) impl<F>(std::move(*this)); }